

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChooseGenerator.cpp
# Opt level: O0

int main(void)

{
  size_t in_stack_000015b0;
  size_t in_stack_000015b8;
  size_t in_stack_000015c0;
  ostream *in_stack_000015c8;
  Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_000015d0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_000015d8;
  SeedType in_stack_000015f0;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff88;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff90;
  AxA_isGreaterThan_A *in_stack_ffffffffffffffa0;
  
  AxA_isGreaterThan_A::AxA_isGreaterThan_A(in_stack_ffffffffffffffa0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  cppqc::
  quickCheckOutput<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
            (in_stack_000015d0,in_stack_000015c8,in_stack_000015c0,in_stack_000015b8,
             in_stack_000015b0,in_stack_000015d8,in_stack_000015f0);
  cppqc::Result::~Result((Result *)0x1144f2);
  AxA_isGreaterThan_A::~AxA_isGreaterThan_A((AxA_isGreaterThan_A *)0x1144fc);
  return 0;
}

Assistant:

int main() {
  cppqc::quickCheckOutput(AxA_isGreaterThan_A());
}